

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_sphere.cpp
# Opt level: O1

ON_BoundingBox * __thiscall
ON_Sphere::BoundingBox(ON_BoundingBox *__return_storage_ptr__,ON_Sphere *this)

{
  double dVar1;
  double dVar2;
  
  ON_BoundingBox::ON_BoundingBox(__return_storage_ptr__);
  dVar1 = this->radius;
  (__return_storage_ptr__->m_min).z = (this->plane).origin.z;
  dVar2 = (this->plane).origin.y;
  (__return_storage_ptr__->m_min).x = (this->plane).origin.x;
  (__return_storage_ptr__->m_min).y = dVar2;
  dVar2 = (this->plane).origin.y;
  (__return_storage_ptr__->m_max).x = (this->plane).origin.x;
  (__return_storage_ptr__->m_max).y = dVar2;
  (__return_storage_ptr__->m_max).z = (this->plane).origin.z;
  (__return_storage_ptr__->m_min).x = (__return_storage_ptr__->m_min).x - dVar1;
  (__return_storage_ptr__->m_min).y = (__return_storage_ptr__->m_min).y - dVar1;
  (__return_storage_ptr__->m_min).z = (__return_storage_ptr__->m_min).z - dVar1;
  (__return_storage_ptr__->m_max).x = (__return_storage_ptr__->m_max).x + dVar1;
  (__return_storage_ptr__->m_max).y = (__return_storage_ptr__->m_max).y + dVar1;
  (__return_storage_ptr__->m_max).z = dVar1 + (__return_storage_ptr__->m_max).z;
  return __return_storage_ptr__;
}

Assistant:

ON_BoundingBox ON_Sphere::BoundingBox() const
{
  ON_BoundingBox bbox;
  double r = Radius();
  bbox.m_min = Center();
  bbox.m_max = bbox.m_min;
  bbox.m_min.x -= r;
  bbox.m_min.y -= r;
  bbox.m_min.z -= r;
  bbox.m_max.x += r;
  bbox.m_max.y += r;
  bbox.m_max.z += r;
  return bbox;
}